

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

void g_list_free(GList *list)

{
  GList *pGVar1;
  GList *local_28;
  GList *prev;
  GList *next;
  GList *lp;
  GList *list_local;
  
  local_28 = (GList *)0x0;
  next = list;
  if (list != (GList *)0x0) {
    local_28 = list->prev;
  }
  while (next != (GList *)0x0) {
    pGVar1 = next->next;
    free(next);
    next = pGVar1;
  }
  next = local_28;
  while (next != (GList *)0x0) {
    pGVar1 = next->prev;
    free(next);
    next = pGVar1;
  }
  return;
}

Assistant:

void g_list_free(GList *list)
{
    GList *lp, *next, *prev = NULL;
    if (list) prev = list->prev;
    for (lp = list; lp; lp = next) {
        next = lp->next;
        free(lp);
    }
    for (lp = prev; lp; lp = prev) {
        prev = lp->prev;
        free(lp);
    }
}